

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie.cpp
# Opt level: O3

int32_t utrie_serialize_63(UNewTrie *trie,void *dt,int32_t capacity,
                          UNewTrieGetFoldedValue *getFoldedValue,UBool reduceTo16Bits,
                          UErrorCode *pErrorCode)

{
  int iVar1;
  uint32_t *puVar2;
  uint32_t *puVar3;
  UBool UVar4;
  uint32_t value;
  code *pcVar5;
  UNewTrie *pUVar6;
  ushort uVar7;
  int iVar8;
  uint32_t uVar9;
  uint uVar10;
  int32_t *piVar11;
  UErrorCode *pErrorCode_00;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  undefined2 *__dest;
  int32_t *piVar15;
  int iVar16;
  ulong uVar17;
  uint uVar18;
  int32_t iVar19;
  byte bVar20;
  int32_t local_b8 [34];
  
  bVar20 = 0;
  if (pErrorCode == (UErrorCode *)0x0) {
    return 0;
  }
  if (U_ZERO_ERROR < *pErrorCode) {
    return 0;
  }
  if ((capacity < 0 || trie == (UNewTrie *)0x0) || (dt == (void *)0x0 && capacity != 0)) {
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return 0;
  }
  if (trie->isCompacted != '\0') goto LAB_002ec125;
  pcVar5 = defaultGetFoldedValue;
  if (getFoldedValue != (UNewTrieGetFoldedValue *)0x0) {
    pcVar5 = getFoldedValue;
  }
  iVar19 = 0;
  utrie_compact(trie,'\0',(UErrorCode *)(ulong)(uint)*pErrorCode);
  piVar11 = trie->index + 0x6c0;
  piVar15 = local_b8;
  for (lVar12 = 0x20; lVar12 != 0; lVar12 = lVar12 + -1) {
    *piVar15 = *piVar11;
    piVar11 = piVar11 + (ulong)bVar20 * -2 + 1;
    piVar15 = piVar15 + (ulong)bVar20 * -2 + 1;
  }
  uVar9 = trie->leadUnitValue;
  puVar3 = trie->data;
  if (uVar9 == *puVar3) {
LAB_002ec202:
    lVar12 = 0x6c0;
    do {
      piVar11 = trie->index + lVar12;
      *piVar11 = iVar19;
      piVar11[1] = iVar19;
      piVar11[2] = iVar19;
      piVar11[3] = iVar19;
      lVar12 = lVar12 + 4;
    } while (lVar12 != 0x6e0);
    uVar10 = 0x10000;
    uVar17 = 0x800;
    do {
      if (trie->index[(int)uVar10 >> 5] == 0) {
        uVar10 = uVar10 + 0x20;
      }
      else {
        uVar18 = uVar10 & 0xfffffc00;
        iVar16 = (int)uVar17;
        uVar14 = uVar17;
        if (0x800 < iVar16) {
          piVar11 = trie->index + 0x800;
          uVar13 = 0x800;
          do {
            uVar14 = uVar13;
            lVar12 = 0;
            while (piVar11[lVar12] == trie->index[((int)uVar18 >> 5) + lVar12]) {
              lVar12 = lVar12 + 1;
              if (lVar12 == 0x20) goto LAB_002ec2a2;
            }
            uVar13 = uVar14 + 0x20;
            piVar11 = piVar11 + 0x20;
            uVar14 = uVar17;
          } while (uVar13 < uVar17);
        }
LAB_002ec2a2:
        value = (*pcVar5)(trie,uVar18,(int)uVar14 + 0x20);
        uVar7 = (short)(uVar10 >> 10) + 0xd7c0;
        uVar9 = 0;
        if (trie->isCompacted == '\0') {
          iVar8 = trie->index[uVar7 >> 5];
          iVar1 = -iVar8;
          if (0 < iVar8) {
            iVar1 = iVar8;
          }
          uVar9 = trie->data[(uVar10 >> 10 & 0x1f) + iVar1];
        }
        if (value != uVar9) {
          UVar4 = utrie_set32_63(trie,(uint)uVar7,value);
          if (UVar4 == '\0') goto LAB_002ec41c;
          if ((int)uVar14 == iVar16) {
            memmove(trie->index + iVar16,trie->index + ((int)uVar18 >> 5),0x80);
            uVar17 = (ulong)(iVar16 + 0x20);
          }
        }
        uVar10 = uVar18 + 0x400;
      }
    } while ((int)uVar10 < 0x110000);
    iVar16 = (int)uVar17;
    if (iVar16 < 0x8800) {
      memmove(trie->index + 0x820,trie->index + 0x800,(long)(iVar16 * 4 + -0x2000));
      piVar11 = local_b8;
      piVar15 = trie->index + 0x800;
      for (lVar12 = 0x20; lVar12 != 0; lVar12 = lVar12 + -1) {
        *piVar15 = *piVar11;
        piVar11 = piVar11 + (ulong)bVar20 * -2 + 1;
        piVar15 = piVar15 + (ulong)bVar20 * -2 + 1;
      }
      trie->indexLength = iVar16 + 0x20;
      pErrorCode_00 = (UErrorCode *)(ulong)(uint)*pErrorCode;
    }
    else {
      *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
      pErrorCode_00 = (UErrorCode *)0x8;
    }
  }
  else {
    uVar10 = trie->dataLength;
    if (((int)(uVar10 + 0x20) <= trie->dataCapacity) &&
       (trie->dataLength = uVar10 + 0x20, -1 < (int)uVar10)) {
      lVar12 = 0;
      do {
        puVar2 = puVar3 + (ulong)uVar10 + lVar12;
        *puVar2 = uVar9;
        puVar2[1] = uVar9;
        puVar2[2] = uVar9;
        puVar2[3] = uVar9;
        lVar12 = lVar12 + 4;
      } while (lVar12 != 0x20);
      iVar19 = -uVar10;
      goto LAB_002ec202;
    }
LAB_002ec41c:
    *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
    pErrorCode_00 = (UErrorCode *)0x7;
  }
  utrie_compact(trie,'\x01',pErrorCode_00);
  trie->isCompacted = '\x01';
  if (U_ZERO_ERROR < *pErrorCode) {
    return 0;
  }
LAB_002ec125:
  iVar16 = trie->dataLength;
  iVar8 = iVar16;
  if (reduceTo16Bits != '\0') {
    iVar8 = trie->indexLength + iVar16;
  }
  if (0x3ffff < iVar8) {
    *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
  }
  iVar8 = trie->indexLength;
  if (reduceTo16Bits == '\0') {
    iVar1 = iVar16 * 4 + iVar8 * 2;
  }
  else {
    iVar1 = (iVar16 + iVar8) * 2;
  }
  if (iVar1 + 0x10 <= capacity) {
    *(undefined4 *)dt = 0x54726965;
    uVar10 = (uint)(reduceTo16Bits == '\0') << 8;
    *(uint *)((long)dt + 4) = uVar10 | 0x25;
    if (trie->isLatin1Linear != '\0') {
      *(uint *)((long)dt + 4) = uVar10 | 0x225;
    }
    __dest = (undefined2 *)((long)dt + 0x10);
    *(int *)((long)dt + 8) = iVar8;
    *(int *)((long)dt + 0xc) = iVar16;
    if (reduceTo16Bits == '\0') {
      if (0 < iVar8) {
        uVar10 = iVar8 + 1;
        pUVar6 = trie;
        do {
          piVar11 = pUVar6->index;
          pUVar6 = (UNewTrie *)(pUVar6->index + 1);
          *__dest = (short)((uint)*piVar11 >> 2);
          __dest = __dest + 1;
          uVar10 = uVar10 - 1;
        } while (1 < uVar10);
      }
      memcpy(__dest,trie->data,(long)iVar16 << 2);
    }
    else {
      if (0 < iVar8) {
        uVar10 = iVar8 + 1;
        pUVar6 = trie;
        do {
          piVar11 = pUVar6->index;
          pUVar6 = (UNewTrie *)(pUVar6->index + 1);
          *__dest = (short)((uint)(*piVar11 + iVar8) >> 2);
          __dest = __dest + 1;
          uVar10 = uVar10 - 1;
        } while (1 < uVar10);
      }
      if (0 < iVar16) {
        puVar3 = trie->data;
        uVar10 = iVar16 + 1;
        lVar12 = 0;
        do {
          *(undefined2 *)((long)__dest + lVar12) = *(undefined2 *)((long)puVar3 + lVar12 * 2);
          uVar10 = uVar10 - 1;
          lVar12 = lVar12 + 2;
        } while (1 < uVar10);
      }
    }
  }
  return iVar1 + 0x10;
}

Assistant:

U_CAPI int32_t U_EXPORT2
utrie_serialize(UNewTrie *trie, void *dt, int32_t capacity,
                UNewTrieGetFoldedValue *getFoldedValue,
                UBool reduceTo16Bits,
                UErrorCode *pErrorCode) {
    UTrieHeader *header;
    uint32_t *p;
    uint16_t *dest16;
    int32_t i, length;
    uint8_t* data = NULL;

    /* argument check */
    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return 0;
    }

    if(trie==NULL || capacity<0 || (capacity>0 && dt==NULL)) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }
    if(getFoldedValue==NULL) {
        getFoldedValue=defaultGetFoldedValue;
    }

    data = (uint8_t*)dt;
    /* fold and compact if necessary, also checks that indexLength is within limits */
    if(!trie->isCompacted) {
        /* compact once without overlap to improve folding */
        utrie_compact(trie, FALSE, pErrorCode);

        /* fold the supplementary part of the index array */
        utrie_fold(trie, getFoldedValue, pErrorCode);

        /* compact again with overlap for minimum data array length */
        utrie_compact(trie, TRUE, pErrorCode);

        trie->isCompacted=TRUE;
        if(U_FAILURE(*pErrorCode)) {
            return 0;
        }
    }

    /* is dataLength within limits? */
    if( (reduceTo16Bits ? (trie->dataLength+trie->indexLength) : trie->dataLength) >= UTRIE_MAX_DATA_LENGTH) {
        *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
    }

    length=sizeof(UTrieHeader)+2*trie->indexLength;
    if(reduceTo16Bits) {
        length+=2*trie->dataLength;
    } else {
        length+=4*trie->dataLength;
    }

    if(length>capacity) {
        return length; /* preflighting */
    }

#ifdef UTRIE_DEBUG
    printf("**UTrieLengths(serialize)** index:%6ld  data:%6ld  serialized:%6ld\n",
           (long)trie->indexLength, (long)trie->dataLength, (long)length);
#endif

    /* set the header fields */
    header=(UTrieHeader *)data;
    data+=sizeof(UTrieHeader);

    header->signature=0x54726965; /* "Trie" */
    header->options=UTRIE_SHIFT | (UTRIE_INDEX_SHIFT<<UTRIE_OPTIONS_INDEX_SHIFT);

    if(!reduceTo16Bits) {
        header->options|=UTRIE_OPTIONS_DATA_IS_32_BIT;
    }
    if(trie->isLatin1Linear) {
        header->options|=UTRIE_OPTIONS_LATIN1_IS_LINEAR;
    }

    header->indexLength=trie->indexLength;
    header->dataLength=trie->dataLength;

    /* write the index (stage 1) array and the 16/32-bit data (stage 2) array */
    if(reduceTo16Bits) {
        /* write 16-bit index values shifted right by UTRIE_INDEX_SHIFT, after adding indexLength */
        p=(uint32_t *)trie->index;
        dest16=(uint16_t *)data;
        for(i=trie->indexLength; i>0; --i) {
            *dest16++=(uint16_t)((*p++ + trie->indexLength)>>UTRIE_INDEX_SHIFT);
        }

        /* write 16-bit data values */
        p=trie->data;
        for(i=trie->dataLength; i>0; --i) {
            *dest16++=(uint16_t)*p++;
        }
    } else {
        /* write 16-bit index values shifted right by UTRIE_INDEX_SHIFT */
        p=(uint32_t *)trie->index;
        dest16=(uint16_t *)data;
        for(i=trie->indexLength; i>0; --i) {
            *dest16++=(uint16_t)(*p++ >> UTRIE_INDEX_SHIFT);
        }

        /* write 32-bit data values */
        uprv_memcpy(dest16, trie->data, 4*(size_t)trie->dataLength);
    }

    return length;
}